

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.cpp
# Opt level: O0

void __thiscall
btBox2dShape::getAabb(btBox2dShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btBox2dShape *in_RDI;
  btVector3 *in_stack_00000090;
  btVector3 *in_stack_00000098;
  btTransform *in_stack_000000a0;
  btScalar in_stack_000000ac;
  btVector3 *in_stack_000000b0;
  
  getHalfExtentsWithoutMargin(in_RDI);
  (*(in_RDI->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  btTransformAabb(in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_00000098,
                  in_stack_00000090);
  return;
}

Assistant:

void btBox2dShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	btTransformAabb(getHalfExtentsWithoutMargin(),getMargin(),t,aabbMin,aabbMax);
}